

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__horizontal_gather_7_channels_with_n_coeffs_mod3
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float *pfVar26;
  float *pfVar27;
  int iVar28;
  float *pfVar29;
  long lVar30;
  float *pfVar31;
  float *pfVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  
  pfVar1 = output_buffer + output_sub_size * 7;
  pfVar29 = horizontal_coefficients + 4;
  do {
    lVar30 = (long)(horizontal_contributors->n0 * 7);
    pfVar26 = decode_buffer + lVar30;
    fVar36 = *horizontal_coefficients;
    fVar44 = horizontal_coefficients[1];
    fVar41 = horizontal_coefficients[2];
    fVar2 = horizontal_coefficients[3];
    fVar37 = pfVar26[0xe] * fVar41 + *pfVar26 * fVar36;
    fVar38 = pfVar26[0xf] * fVar41 + pfVar26[1] * fVar36;
    fVar39 = pfVar26[0x10] * fVar41 + pfVar26[2] * fVar36;
    fVar40 = pfVar26[0x11] * fVar41 + pfVar26[3] * fVar36;
    fVar33 = pfVar26[0x11] * fVar41 + pfVar26[3] * fVar36;
    fVar34 = pfVar26[0x12] * fVar41 + pfVar26[4] * fVar36;
    fVar35 = pfVar26[0x13] * fVar41 + pfVar26[5] * fVar36;
    fVar36 = pfVar26[0x14] * fVar41 + pfVar26[6] * fVar36;
    fVar45 = pfVar26[0x15] * fVar2 + pfVar26[7] * fVar44;
    fVar46 = pfVar26[0x16] * fVar2 + pfVar26[8] * fVar44;
    fVar47 = pfVar26[0x17] * fVar2 + pfVar26[9] * fVar44;
    fVar48 = pfVar26[0x18] * fVar2 + pfVar26[10] * fVar44;
    fVar41 = pfVar26[0x18] * fVar2 + fVar44 * pfVar26[10];
    fVar42 = pfVar26[0x19] * fVar2 + fVar44 * pfVar26[0xb];
    fVar43 = pfVar26[0x1a] * fVar2 + fVar44 * pfVar26[0xc];
    fVar44 = pfVar26[0x1b] * fVar2 + fVar44 * pfVar26[0xd];
    iVar28 = ((horizontal_contributors->n1 - horizontal_contributors->n0) + -3 >> 2) + 1;
    pfVar26 = decode_buffer + lVar30 + 0x1c;
    pfVar27 = pfVar29;
    do {
      pfVar32 = pfVar27;
      pfVar31 = pfVar26;
      fVar2 = *pfVar32;
      fVar3 = pfVar32[1];
      fVar4 = pfVar32[2];
      fVar5 = pfVar32[3];
      fVar37 = pfVar31[0xe] * fVar4 + *pfVar31 * fVar2 + fVar37;
      fVar38 = pfVar31[0xf] * fVar4 + pfVar31[1] * fVar2 + fVar38;
      fVar39 = pfVar31[0x10] * fVar4 + pfVar31[2] * fVar2 + fVar39;
      fVar40 = pfVar31[0x11] * fVar4 + pfVar31[3] * fVar2 + fVar40;
      fVar33 = pfVar31[0x11] * fVar4 + pfVar31[3] * fVar2 + fVar33;
      fVar34 = pfVar31[0x12] * fVar4 + pfVar31[4] * fVar2 + fVar34;
      fVar35 = pfVar31[0x13] * fVar4 + pfVar31[5] * fVar2 + fVar35;
      fVar36 = pfVar31[0x14] * fVar4 + pfVar31[6] * fVar2 + fVar36;
      fVar45 = pfVar31[0x15] * fVar5 + pfVar31[7] * fVar3 + fVar45;
      fVar46 = pfVar31[0x16] * fVar5 + pfVar31[8] * fVar3 + fVar46;
      fVar47 = pfVar31[0x17] * fVar5 + pfVar31[9] * fVar3 + fVar47;
      fVar48 = pfVar31[0x18] * fVar5 + pfVar31[10] * fVar3 + fVar48;
      fVar41 = pfVar31[0x18] * fVar5 + fVar3 * pfVar31[10] + fVar41;
      fVar42 = pfVar31[0x19] * fVar5 + fVar3 * pfVar31[0xb] + fVar42;
      fVar43 = pfVar31[0x1a] * fVar5 + fVar3 * pfVar31[0xc] + fVar43;
      fVar44 = pfVar31[0x1b] * fVar5 + fVar3 * pfVar31[0xd] + fVar44;
      iVar28 = iVar28 + -1;
      pfVar26 = pfVar31 + 0x1c;
      pfVar27 = pfVar32 + 4;
    } while (1 < iVar28);
    fVar2 = pfVar32[4];
    fVar3 = pfVar32[5];
    fVar4 = pfVar32[6];
    fVar5 = pfVar31[0x1c];
    fVar6 = pfVar31[0x1d];
    fVar7 = pfVar31[0x1e];
    fVar8 = pfVar31[0x1f];
    fVar9 = pfVar31[0x20];
    fVar10 = pfVar31[0x21];
    fVar11 = pfVar31[0x22];
    fVar12 = pfVar31[0x23];
    fVar13 = pfVar31[0x24];
    fVar14 = pfVar31[0x25];
    fVar15 = pfVar31[0x26];
    fVar16 = pfVar31[0x27];
    fVar17 = pfVar31[0x28];
    fVar18 = pfVar31[0x29];
    fVar19 = pfVar31[0x2a];
    fVar20 = pfVar31[0x2b];
    fVar21 = pfVar31[0x2c];
    fVar22 = pfVar31[0x2d];
    fVar23 = pfVar31[0x2e];
    fVar24 = pfVar31[0x2f];
    fVar25 = pfVar31[0x30];
    output_buffer[3] =
         pfVar31[0x2d] * fVar4 + fVar33 + pfVar31[0x1f] * fVar2 + fVar41 + fVar3 * pfVar31[0x26];
    output_buffer[4] = fVar23 * fVar4 + fVar34 + fVar9 * fVar2 + fVar42 + fVar3 * fVar16;
    output_buffer[5] = fVar24 * fVar4 + fVar35 + fVar10 * fVar2 + fVar43 + fVar3 * fVar17;
    output_buffer[6] = fVar25 * fVar4 + fVar36 + fVar11 * fVar2 + fVar44 + fVar3 * fVar18;
    *output_buffer = fVar19 * fVar4 + fVar37 + fVar5 * fVar2 + fVar45 + fVar12 * fVar3;
    output_buffer[1] = fVar20 * fVar4 + fVar38 + fVar6 * fVar2 + fVar46 + fVar13 * fVar3;
    output_buffer[2] = fVar21 * fVar4 + fVar39 + fVar7 * fVar2 + fVar47 + fVar14 * fVar3;
    output_buffer[3] = fVar22 * fVar4 + fVar40 + fVar8 * fVar2 + fVar48 + fVar15 * fVar3;
    horizontal_coefficients = horizontal_coefficients + coefficient_width;
    horizontal_contributors = horizontal_contributors + 1;
    output_buffer = output_buffer + 7;
    pfVar29 = pfVar29 + coefficient_width;
  } while (output_buffer < pfVar1);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_n_coeffs_mod3 )( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  stbir__3_coeff_setup();
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    int n = ( ( horizontal_contributors->n1 - horizontal_contributors->n0 + 1 ) - 7 + 3 ) >> 2;
    float const * hc = horizontal_coefficients;

    stbir__4_coeff_start();
    STBIR_SIMD_NO_UNROLL_LOOP_START
    do {
      hc += 4;
      decode += STBIR__horizontal_channels * 4;
      stbir__4_coeff_continue_from_4( 0 );
      --n;
    } while ( n > 0 );
    stbir__3_coeff_remnant( 4 );

    stbir__store_output();
  } while ( output < output_end );
}